

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

ListSchema capnp::ListSchema::of(Reader elementType,Schema context)

{
  Reader elementType_00;
  Which WVar1;
  anon_union_8_2_eba6ea51_for_Type_5 aVar2;
  ulong uVar3;
  undefined8 uVar4;
  Type TVar5;
  ListSchema LVar6;
  undefined8 unaff_retaddr;
  SegmentReader *in_stack_00000008;
  CapTableReader *in_stack_00000010;
  Which *in_stack_00000018;
  WirePointer *in_stack_00000020;
  uint in_stack_00000028;
  short in_stack_0000002c;
  undefined2 in_stack_0000002e;
  Fault f;
  Schema local_68;
  PointerReader local_60;
  undefined1 local_40 [48];
  
  if (in_stack_00000028 < 0x10) {
    WVar1 = VOID;
  }
  else {
    WVar1 = *in_stack_00000018;
  }
  if (WVar1 < LIST) {
    if (in_stack_00000028 < 0x10) {
      WVar1 = VOID;
    }
    else {
      WVar1 = *in_stack_00000018;
    }
    TVar5 = (Type)of(WVar1);
  }
  else {
    switch(WVar1) {
    case LIST:
      local_60.capTable = in_stack_00000010;
      local_60.pointer = in_stack_00000020;
      local_60.segment = in_stack_00000008;
      if (in_stack_0000002c == 0) {
        context.raw._0_4_ = 0x7fffffff;
        local_60.capTable = (CapTableReader *)0x0;
        local_60.pointer = (WirePointer *)0x0;
        local_60.segment = (SegmentReader *)0x0;
      }
      local_60.nestingLimit = (int)context.raw;
      capnp::_::PointerReader::getStruct((StructReader *)local_40,&local_60,(word *)0x0);
      elementType_00._reader.capTable = (CapTableReader *)in_stack_00000008;
      elementType_00._reader.segment = (SegmentReader *)unaff_retaddr;
      elementType_00._reader.data = in_stack_00000010;
      elementType_00._reader.pointers = (WirePointer *)in_stack_00000018;
      elementType_00._reader._32_8_ = in_stack_00000020;
      elementType_00._reader.nestingLimit = in_stack_00000028;
      elementType_00._reader._44_2_ = in_stack_0000002c;
      elementType_00._reader._46_2_ = in_stack_0000002e;
      LVar6 = of(elementType_00,(Schema)local_40._40_8_);
      uVar3 = LVar6.elementType._0_8_ & 0xffffffffff00ffff |
              (ulong)(LVar6.elementType._0_4_ + 0x10000U & 0xff0000);
      TVar5.field_4.schema = LVar6.elementType.field_4.schema;
      TVar5.baseType = (short)uVar3;
      TVar5.listDepth = (char)(uVar3 >> 0x10);
      TVar5.isImplicitParam = (bool)(char)(uVar3 >> 0x18);
      TVar5.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar3 >> 0x20);
      TVar5._6_2_ = (short)(uVar3 >> 0x30);
      break;
    case ENUM:
      if (in_stack_00000028 < 0x80) {
        uVar4 = VOID;
      }
      else {
        uVar4 = *(undefined8 *)(in_stack_00000018 + 4);
      }
      local_60.segment = (SegmentReader *)Schema::getDependency(&local_68,uVar4,0);
      aVar2 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum((Schema *)&local_60);
      TVar5.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar2.schema;
      TVar5.baseType = ENUM;
      TVar5.listDepth = '\0';
      TVar5.isImplicitParam = false;
      TVar5.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      TVar5._6_2_ = 0;
      break;
    case STRUCT:
      if (in_stack_00000028 < 0x80) {
        uVar4 = VOID;
      }
      else {
        uVar4 = *(undefined8 *)(in_stack_00000018 + 4);
      }
      local_60.segment = (SegmentReader *)Schema::getDependency(&local_68,uVar4,0);
      aVar2 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct((Schema *)&local_60);
      TVar5.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar2.schema;
      TVar5.baseType = STRUCT;
      TVar5.listDepth = '\0';
      TVar5.isImplicitParam = false;
      TVar5.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      TVar5._6_2_ = 0;
      break;
    case INTERFACE:
      if (in_stack_00000028 < 0x80) {
        uVar4 = VOID;
      }
      else {
        uVar4 = *(undefined8 *)(in_stack_00000018 + 4);
      }
      local_60.segment = (SegmentReader *)Schema::getDependency(&local_68,uVar4,0);
      aVar2 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asInterface((Schema *)&local_60);
      TVar5.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar2.schema;
      TVar5.baseType = INTERFACE;
      TVar5.listDepth = '\0';
      TVar5.isImplicitParam = false;
      TVar5.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      TVar5._6_2_ = 0;
      break;
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
                 ,0x306,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::fatal((Fault *)&local_60);
    default:
      TVar5 = (Type)ZEXT416(0);
      if (0xf < in_stack_00000028) {
        TVar5 = (Type)ZEXT216(*in_stack_00000018);
      }
    }
  }
  return (ListSchema)TVar5;
}

Assistant:

ListSchema ListSchema::of(schema::Type::Reader elementType, Schema context) {
  // This method is deprecated because it can only be implemented in terms of other deprecated
  // methods. Temporarily disable warnings for those other deprecated methods.
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wdeprecated-declarations"

  switch (elementType.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return of(elementType.which());

    case schema::Type::STRUCT:
      return of(context.getDependency(elementType.getStruct().getTypeId()).asStruct());

    case schema::Type::ENUM:
      return of(context.getDependency(elementType.getEnum().getTypeId()).asEnum());

    case schema::Type::INTERFACE:
      return of(context.getDependency(elementType.getInterface().getTypeId()).asInterface());

    case schema::Type::LIST:
      return of(of(elementType.getList().getElementType(), context));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("List(AnyPointer) not supported.");
      return ListSchema();
  }

  // Unknown type is acceptable.
  return ListSchema(elementType.which());
#pragma GCC diagnostic pop
}